

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cc
# Opt level: O3

void sptk::world::fast_fftfilt
               (double *x,int x_length,double *h,int h_length,int fft_size,
               ForwardRealFFT *forward_real_fft,InverseRealFFT *inverse_real_fft,double *y)

{
  double dVar1;
  double dVar2;
  fft_complex *padVar3;
  fft_complex *padVar4;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  void *pvVar5;
  undefined4 in_register_0000000c;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  fft_plan *pfVar10;
  fft_plan *pfVar11;
  double *pdVar12;
  byte bVar13;
  double dVar14;
  double adStackY_a8 [5];
  undefined1 in_stack_ffffffffffffff80 [32];
  undefined4 in_stack_ffffffffffffffa8;
  int iVar15;
  int iVar16;
  InverseRealFFT *pIVar17;
  
  uVar6 = CONCAT44(in_register_0000000c,h_length);
  bVar13 = 0;
  uVar8 = 0xffffffffffffffff;
  if (-1 < fft_size) {
    uVar8 = (ulong)(uint)fft_size << 4;
  }
  pvVar5 = operator_new__(uVar8);
  dVar14 = (double)fft_size;
  if (0 < x_length) {
    pdVar12 = forward_real_fft->waveform;
    uVar8 = 0;
    do {
      pdVar12[uVar8] = x[uVar8] / dVar14;
      uVar8 = uVar8 + 1;
    } while ((uint)x_length != uVar8);
  }
  iVar15 = fft_size;
  if (x_length < fft_size) {
    memset(forward_real_fft->waveform + x_length,0,(ulong)(uint)(~x_length + fft_size) * 8 + 8);
  }
  pfVar11 = &forward_real_fft->forward_fft;
  pfVar10 = pfVar11;
  pdVar12 = adStackY_a8;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar12 = (double)*(undefined8 *)pfVar10;
    pfVar10 = (fft_plan *)((long)pfVar10 + (ulong)bVar13 * -0x10 + 8);
    pdVar12 = pdVar12 + (ulong)bVar13 * -2 + 1;
  }
  p.c_out = (fft_complex *)forward_real_fft;
  p.n = in_stack_ffffffffffffff80._0_4_;
  p.sign = in_stack_ffffffffffffff80._4_4_;
  p.flags = in_stack_ffffffffffffff80._8_4_;
  p._12_4_ = in_stack_ffffffffffffff80._12_4_;
  p.c_in = (fft_complex *)in_stack_ffffffffffffff80._16_8_;
  p.in = (double *)in_stack_ffffffffffffff80._24_8_;
  p.out._0_4_ = in_stack_ffffffffffffffa8;
  p.out._4_4_ = iVar15;
  p.input = (double *)dVar14;
  p.ip = (int *)uVar6;
  p.w = (double *)inverse_real_fft;
  fft_execute(p);
  if (-2 < fft_size) {
    padVar3 = forward_real_fft->spectrum;
    lVar7 = 0;
    do {
      *(undefined8 *)((long)pvVar5 + lVar7) = *(undefined8 *)((long)*padVar3 + lVar7);
      *(undefined8 *)((long)pvVar5 + lVar7 + 8) = *(undefined8 *)((long)*padVar3 + lVar7 + 8);
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(fft_size / 2 + 1) << 4 != lVar7);
  }
  uVar9 = (uint)uVar6;
  if (0 < (int)uVar9) {
    pdVar12 = forward_real_fft->waveform;
    uVar8 = 0;
    do {
      pdVar12[uVar8] = h[uVar8] / dVar14;
      uVar8 = uVar8 + 1;
    } while ((uVar6 & 0xffffffff) != uVar8);
  }
  iVar16 = iVar15;
  if ((int)uVar9 < iVar15) {
    memset(forward_real_fft->waveform + (int)uVar9,0,(ulong)(~uVar9 + iVar15) * 8 + 8);
  }
  pdVar12 = adStackY_a8;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar12 = (double)*(undefined8 *)pfVar11;
    pfVar11 = (fft_plan *)((long)pfVar11 + (ulong)bVar13 * -0x10 + 8);
    pdVar12 = pdVar12 + (ulong)bVar13 * -2 + 1;
  }
  p_00.c_out = (fft_complex *)forward_real_fft;
  p_00.n = in_stack_ffffffffffffff80._0_4_;
  p_00.sign = in_stack_ffffffffffffff80._4_4_;
  p_00.flags = in_stack_ffffffffffffff80._8_4_;
  p_00._12_4_ = in_stack_ffffffffffffff80._12_4_;
  p_00.c_in = (fft_complex *)in_stack_ffffffffffffff80._16_8_;
  p_00.in = (double *)in_stack_ffffffffffffff80._24_8_;
  p_00.out._0_4_ = in_stack_ffffffffffffffa8;
  p_00.out._4_4_ = iVar16;
  p_00.input = (double *)dVar14;
  p_00.ip = (int *)uVar6;
  p_00.w = (double *)inverse_real_fft;
  fft_execute(p_00);
  if (-2 < iVar15) {
    padVar3 = forward_real_fft->spectrum;
    padVar4 = inverse_real_fft->spectrum;
    lVar7 = 0;
    do {
      dVar1 = *(double *)((long)pvVar5 + lVar7);
      dVar2 = *(double *)((long)pvVar5 + lVar7 + 8);
      *(double *)((long)*padVar4 + lVar7) =
           *(double *)((long)*padVar3 + lVar7) * dVar1 -
           *(double *)((long)*padVar3 + lVar7 + 8) * dVar2;
      *(double *)((long)*padVar4 + lVar7 + 8) =
           dVar1 * *(double *)((long)*padVar3 + lVar7 + 8) +
           dVar2 * *(double *)((long)*padVar3 + lVar7);
      lVar7 = lVar7 + 0x10;
    } while ((ulong)(uint)(fft_size / 2) * 0x10 + 0x10 != lVar7);
  }
  pfVar11 = &inverse_real_fft->inverse_fft;
  pdVar12 = adStackY_a8;
  pIVar17 = inverse_real_fft;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    *pdVar12 = (double)*(undefined8 *)pfVar11;
    pfVar11 = (fft_plan *)((long)pfVar11 + (ulong)bVar13 * -0x10 + 8);
    pdVar12 = pdVar12 + (ulong)bVar13 * -2 + 1;
  }
  p_01.c_out = (fft_complex *)forward_real_fft;
  p_01.n = in_stack_ffffffffffffff80._0_4_;
  p_01.sign = in_stack_ffffffffffffff80._4_4_;
  p_01.flags = in_stack_ffffffffffffff80._8_4_;
  p_01._12_4_ = in_stack_ffffffffffffff80._12_4_;
  p_01.c_in = (fft_complex *)in_stack_ffffffffffffff80._16_8_;
  p_01.in = (double *)in_stack_ffffffffffffff80._24_8_;
  p_01.out._0_4_ = in_stack_ffffffffffffffa8;
  p_01.out._4_4_ = iVar16;
  p_01.input = (double *)dVar14;
  p_01.ip = (int *)uVar6;
  p_01.w = (double *)pIVar17;
  fft_execute(p_01);
  if (0 < iVar15) {
    pdVar12 = inverse_real_fft->waveform;
    uVar8 = 0;
    do {
      y[uVar8] = pdVar12[uVar8];
      uVar8 = uVar8 + 1;
    } while ((uint)fft_size != uVar8);
  }
  operator_delete__(pvVar5);
  return;
}

Assistant:

void fast_fftfilt(const double *x, int x_length, const double *h, int h_length,
    int fft_size, const ForwardRealFFT *forward_real_fft,
    const InverseRealFFT *inverse_real_fft, double *y) {
  fft_complex *x_spectrum = new fft_complex[fft_size];

  for (int i = 0; i < x_length; ++i)
    forward_real_fft->waveform[i] = x[i] / fft_size;
  for (int i = x_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);
  for (int i = 0; i <= fft_size / 2; ++i) {
    x_spectrum[i][0] = forward_real_fft->spectrum[i][0];
    x_spectrum[i][1] = forward_real_fft->spectrum[i][1];
  }

  for (int i = 0; i < h_length; ++i)
    forward_real_fft->waveform[i] = h[i] / fft_size;
  for (int i = h_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);

  for (int i = 0; i <= fft_size / 2; ++i) {
    inverse_real_fft->spectrum[i][0] =
      x_spectrum[i][0] * forward_real_fft->spectrum[i][0] -
      x_spectrum[i][1] * forward_real_fft->spectrum[i][1];
    inverse_real_fft->spectrum[i][1] =
      x_spectrum[i][0] * forward_real_fft->spectrum[i][1] +
      x_spectrum[i][1] * forward_real_fft->spectrum[i][0];
  }
  fft_execute(inverse_real_fft->inverse_fft);

  for (int i = 0; i < fft_size; ++i)
    y[i] = inverse_real_fft->waveform[i];

  delete[] x_spectrum;
}